

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark-loop-count.c
# Opt level: O3

int run_benchmark_loop_alive(void)

{
  int iVar1;
  int iVar2;
  uv_loop_t *loop;
  uint64_t uVar3;
  uint64_t uVar4;
  long lVar5;
  uv_idle_t *handle;
  double dVar6;
  undefined1 auVar7 [16];
  int64_t eval_b;
  int64_t eval_a;
  int ticks;
  void *local_28;
  int local_1c;
  
  loop = uv_default_loop();
  local_1c = 0;
  uv_idle_init(loop,&idle_handle);
  idle_handle.data = &stack0xffffffffffffffe4;
  uv_idle_start(&idle_handle,idle_alive_cb);
  uVar3 = uv_hrtime();
  uv_run(loop,UV_RUN_DEFAULT);
  uVar4 = uv_hrtime();
  local_28 = (void *)(long)local_1c;
  if (local_28 == (void *)0xbebc200) {
    lVar5 = uVar4 - uVar3;
    auVar7._8_4_ = (int)((ulong)lVar5 >> 0x20);
    auVar7._0_8_ = lVar5;
    auVar7._12_4_ = 0x45300000;
    dVar6 = ((auVar7._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0)) / 1000000000.0;
    fprintf(_stderr,"loop_alive: %d ticks in %.2fs (%.0f/s)\n",dVar6,200000000.0 / dVar6,200000000);
    fflush(_stderr);
    uv_walk(loop,close_walk_cb,(void *)0x0);
    uv_run(loop,UV_RUN_DEFAULT);
    local_28 = (void *)0x0;
    iVar1 = uv_loop_close(loop);
    if (local_28 == (void *)(long)iVar1) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_benchmark_loop_alive_cold_1();
  }
  handle = (uv_idle_t *)&stack0xffffffffffffffd8;
  run_benchmark_loop_alive_cold_2();
  iVar1 = 200000000;
  do {
    iVar1 = iVar1 + -1;
    if (iVar1 == 0) {
      *(undefined4 *)handle->data = 200000000;
      iVar1 = uv_idle_stop(handle);
      return iVar1;
    }
    iVar2 = uv_loop_alive(handle->loop);
  } while (iVar2 != 0);
  abort();
}

Assistant:

BENCHMARK_IMPL(loop_alive) {
  uv_loop_t* loop = uv_default_loop();
  int ticks = 0;
  uint64_t ns;

  uv_idle_init(loop, &idle_handle);
  idle_handle.data = &ticks;
  uv_idle_start(&idle_handle, idle_alive_cb);

  ns = uv_hrtime();
  uv_run(loop, UV_RUN_DEFAULT);
  ns = uv_hrtime() - ns;

  ASSERT_EQ(ticks, NUM_TICKS2);

  fprintf(stderr, "loop_alive: %d ticks in %.2fs (%.0f/s)\n",
          NUM_TICKS2,
          ns / 1e9,
          NUM_TICKS2 / (ns / 1e9));
  fflush(stderr);

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}